

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O0

int timeval_to_relative_ms(timeval *tv)

{
  int iVar1;
  timeval *in_RDI;
  int r;
  longlong t;
  timeval dt;
  timeval now;
  int local_40;
  long local_30;
  long local_28;
  long local_20;
  timeval local_18;
  timeval *local_8;
  
  local_8 = in_RDI;
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  iVar1 = cmp_timeval(local_8,(timeval *)&local_18);
  if (iVar1 < 0) {
    local_28 = local_18.tv_sec - local_8->tv_sec;
    local_20 = local_18.tv_usec - local_8->tv_usec;
    if (local_20 < 0) {
      local_28 = local_28 + -1;
      local_20 = local_20 + 1000000;
    }
  }
  else {
    local_28 = local_8->tv_sec - local_18.tv_sec;
    local_20 = local_8->tv_usec - local_18.tv_usec;
    if (local_20 < 0) {
      local_28 = local_28 + -1;
      local_20 = local_20 + 1000000;
    }
  }
  local_30 = (local_20 + 500) / 1000 + local_28 * 1000;
  if (local_30 < 0x80000000) {
    if (local_30 < -0x80000000) {
      local_30 = -0x80000000;
    }
  }
  else {
    local_30._0_4_ = 0x7fffffff;
  }
  if (iVar1 < 0) {
    local_40 = -(int)local_30;
  }
  else {
    local_40 = (int)local_30;
  }
  return local_40;
}

Assistant:

static int
timeval_to_relative_ms(struct timeval * tv)
{
  struct timeval now;
  struct timeval dt;
  long long t;
  int r;

  gettimeofday(&now, NULL);
  r = cmp_timeval(tv, &now);
  if (r >= 0) {
    timersub(tv, &now, &dt);
  } else {
    timersub(&now, tv, &dt);
  }
  t = dt.tv_sec;
  t *= 1000;
  t += (dt.tv_usec + 500) / 1000;

  if (t > INT_MAX) {
    t = INT_MAX;
  } else if (t < INT_MIN) {
    t = INT_MIN;
  }

  return r >= 0 ? t : -t;
}